

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
emplace_back<slang::syntax::ExpressionSyntax_const*const&>
          (SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *this,ExpressionSyntax **args)

{
  iterator ppEVar1;
  ExpressionSyntax **args_local;
  SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppEVar1 = SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::end
                        ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)this);
    this_local = (SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)
                 emplaceRealloc<slang::syntax::ExpressionSyntax_const*const&>(this,ppEVar1,args);
  }
  else {
    ppEVar1 = SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::end
                        ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)this);
    *ppEVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)
                 SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::back
                           ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }